

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcMeasureWithUnit::~IfcMeasureWithUnit(IfcMeasureWithUnit *this)

{
  _func_int *p_Var1;
  _func_int *p_Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  
  p_Var2 = (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcMeasureWithUnit,_2UL>).
           _vptr_ObjectHelper[-3];
  p_Var1 = (_func_int *)
           ((long)&(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcMeasureWithUnit,_2UL>).
                   _vptr_ObjectHelper + (long)p_Var2);
  *(undefined ***)
   ((long)&(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcMeasureWithUnit,_2UL>).
           _vptr_ObjectHelper + (long)p_Var2) = &PTR__IfcMeasureWithUnit_008b35a8;
  *(undefined ***)(&this->field_0x30 + (long)p_Var2) = &PTR__IfcMeasureWithUnit_008b35d0;
  if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(&this->field_0x28 + (long)p_Var2) !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(&this->field_0x28 + (long)p_Var2))
    ;
  }
  this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(p_Var1 + 0x18);
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  operator_delete(p_Var1);
  return;
}

Assistant:

IfcMeasureWithUnit() : Object("IfcMeasureWithUnit") {}